

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

void google::protobuf::swap(FieldOptions_EditionDefault *a,FieldOptions_EditionDefault *b)

{
  FieldOptions_EditionDefault *b_local;
  FieldOptions_EditionDefault *a_local;
  
  FieldOptions_EditionDefault::Swap(a,b);
  return;
}

Assistant:

friend void swap(FieldOptions_EditionDefault& a, FieldOptions_EditionDefault& b) { a.Swap(&b); }